

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

HelicsCore helicsCreateCore(char *type,char *name,char *initString,HelicsError *err)

{
  size_type sVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string_view type_00;
  CoreType type_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Alloc_hider _Var7;
  string_view coreName;
  string_view newError;
  string_view configureString;
  string_view configureString_00;
  __single_object core;
  char *in_stack_ffffffffffffff58;
  size_type *psVar8;
  MasterObjectHolder *this_00;
  undefined8 uStack_a0;
  size_type local_98;
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  MasterObjectHolder *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (type == (char *)0x0) {
      type_01 = DEFAULT;
    }
    else {
      strlen(type);
      type_00._M_str = in_stack_ffffffffffffff58;
      type_00._M_len = 0x197feb;
      type_01 = helics::core::coreTypeFromString(type_00);
    }
    if (type_01 != UNRECOGNIZED) {
      local_88._M_dataplus._M_p = (pointer)operator_new(0x48);
      local_88._M_dataplus._M_p[0x30] = '\0';
      local_88._M_dataplus._M_p[0x31] = '\0';
      local_88._M_dataplus._M_p[0x32] = '\0';
      local_88._M_dataplus._M_p[0x33] = '\0';
      local_88._M_dataplus._M_p[0x34] = '\0';
      local_88._M_dataplus._M_p[0x35] = '\0';
      local_88._M_dataplus._M_p[0x36] = '\0';
      local_88._M_dataplus._M_p[0x37] = '\0';
      local_88._M_dataplus._M_p[0x38] = '\0';
      local_88._M_dataplus._M_p[0x39] = '\0';
      local_88._M_dataplus._M_p[0x3a] = '\0';
      local_88._M_dataplus._M_p[0x3b] = '\0';
      local_88._M_dataplus._M_p[0x3c] = '\0';
      local_88._M_dataplus._M_p[0x3d] = '\0';
      local_88._M_dataplus._M_p[0x3e] = '\0';
      local_88._M_dataplus._M_p[0x3f] = '\0';
      local_88._M_dataplus._M_p[0x20] = '\0';
      local_88._M_dataplus._M_p[0x21] = '\0';
      local_88._M_dataplus._M_p[0x22] = '\0';
      local_88._M_dataplus._M_p[0x23] = '\0';
      local_88._M_dataplus._M_p[0x24] = '\0';
      local_88._M_dataplus._M_p[0x25] = '\0';
      local_88._M_dataplus._M_p[0x26] = '\0';
      local_88._M_dataplus._M_p[0x27] = '\0';
      local_88._M_dataplus._M_p[0x28] = '\0';
      local_88._M_dataplus._M_p[0x29] = '\0';
      local_88._M_dataplus._M_p[0x2a] = '\0';
      local_88._M_dataplus._M_p[0x2b] = '\0';
      local_88._M_dataplus._M_p[0x2c] = '\0';
      local_88._M_dataplus._M_p[0x2d] = '\0';
      local_88._M_dataplus._M_p[0x2e] = '\0';
      local_88._M_dataplus._M_p[0x2f] = '\0';
      local_88._M_dataplus._M_p[0x10] = '\0';
      local_88._M_dataplus._M_p[0x11] = '\0';
      local_88._M_dataplus._M_p[0x12] = '\0';
      local_88._M_dataplus._M_p[0x13] = '\0';
      local_88._M_dataplus._M_p[0x14] = '\0';
      local_88._M_dataplus._M_p[0x15] = '\0';
      local_88._M_dataplus._M_p[0x16] = '\0';
      local_88._M_dataplus._M_p[0x17] = '\0';
      local_88._M_dataplus._M_p[0x18] = '\0';
      local_88._M_dataplus._M_p[0x19] = '\0';
      local_88._M_dataplus._M_p[0x1a] = '\0';
      local_88._M_dataplus._M_p[0x1b] = '\0';
      local_88._M_dataplus._M_p[0x1c] = '\0';
      local_88._M_dataplus._M_p[0x1d] = '\0';
      local_88._M_dataplus._M_p[0x1e] = '\0';
      local_88._M_dataplus._M_p[0x1f] = '\0';
      local_88._M_dataplus._M_p[0] = '\0';
      local_88._M_dataplus._M_p[1] = '\0';
      local_88._M_dataplus._M_p[2] = '\0';
      local_88._M_dataplus._M_p[3] = '\0';
      local_88._M_dataplus._M_p[4] = '\0';
      local_88._M_dataplus._M_p[5] = '\0';
      local_88._M_dataplus._M_p[6] = '\0';
      local_88._M_dataplus._M_p[7] = '\0';
      local_88._M_dataplus._M_p[8] = '\0';
      local_88._M_dataplus._M_p[9] = '\0';
      local_88._M_dataplus._M_p[10] = '\0';
      local_88._M_dataplus._M_p[0xb] = '\0';
      local_88._M_dataplus._M_p[0xc] = '\0';
      local_88._M_dataplus._M_p[0xd] = '\0';
      local_88._M_dataplus._M_p[0xe] = '\0';
      local_88._M_dataplus._M_p[0xf] = '\0';
      local_88._M_dataplus._M_p[0x40] = '\0';
      local_88._M_dataplus._M_p[0x41] = '\0';
      local_88._M_dataplus._M_p[0x42] = '\0';
      local_88._M_dataplus._M_p[0x43] = '\0';
      local_88._M_dataplus._M_p[0x44] = '\0';
      local_88._M_dataplus._M_p[0x45] = '\0';
      local_88._M_dataplus._M_p[0x46] = '\0';
      local_88._M_dataplus._M_p[0x47] = '\0';
      local_88._M_dataplus._M_p[0x44] = -2;
      local_88._M_dataplus._M_p[0x45] = -1;
      local_88._M_dataplus._M_p[0x46] = -1;
      local_88._M_dataplus._M_p[0x47] = -1;
      local_88._M_dataplus._M_p[0x44] = -0x14;
      local_88._M_dataplus._M_p[0x45] = '$';
      local_88._M_dataplus._M_p[0x46] = -0x7c;
      local_88._M_dataplus._M_p[0x47] = '7';
      pcVar5 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var7 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (name != (char *)0x0) {
        pcVar5 = (char *)strlen(name);
        _Var7._M_p = name;
      }
      if (pcVar5 == (char *)0x0) {
        sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
        _Var7._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
        if (initString != (char *)0x0) {
          sVar4 = strlen(initString);
          _Var7._M_p = initString;
        }
        configureString_00._M_str = _Var7._M_p;
        configureString_00._M_len = sVar4;
        helics::CoreFactory::create
                  ((CoreFactory *)&stack0xffffffffffffff58,type_01,configureString_00);
      }
      else {
        pcVar3 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
        if (initString != (char *)0x0) {
          pcVar3 = (char *)strlen(initString);
        }
        coreName._M_len = (ulong)type_01;
        coreName._M_str = pcVar5;
        configureString._M_str = pcVar3;
        configureString._M_len = (size_t)_Var7._M_p;
        helics::CoreFactory::FindOrCreate
                  ((CoreType)&stack0xffffffffffffff58,coreName,configureString);
      }
      this_00 = (MasterObjectHolder *)0x0;
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_88._M_dataplus._M_p + 8);
      *(char **)local_88._M_dataplus._M_p = in_stack_ffffffffffffff58;
      *(undefined8 *)(local_88._M_dataplus._M_p + 8) = uStack_a0;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      _Var7._M_p = local_88._M_dataplus._M_p;
      getMasterHolder();
      local_68._M_t.
      super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
      super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
      super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
           (__uniq_ptr_data<helics::CoreObject,_std::default_delete<helics::CoreObject>,_true,_true>
           )(__uniq_ptr_data<helics::CoreObject,_std::default_delete<helics::CoreObject>,_true,_true>
             )local_88._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)0x0;
      MasterObjectHolder::addCore(this_00,&local_68);
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
                (&local_68);
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
                ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                 &local_88);
      return _Var7._M_p;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      getMasterHolder();
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"core type ","");
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_60,type);
      local_88._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
      paVar6 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == paVar6) {
        local_88.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_88._M_string_length = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_88," is not recognized");
      psVar8 = (size_type *)(pbVar2->_M_dataplus)._M_p;
      paVar6 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8 == paVar6) {
        local_98 = paVar6->_M_allocated_capacity;
        uStack_90 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        psVar8 = &local_98;
      }
      else {
        local_98 = paVar6->_M_allocated_capacity;
      }
      sVar1 = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      newError._M_str = (char *)psVar8;
      newError._M_len = sVar1;
      pcVar5 = MasterObjectHolder::addErrorString(local_40,newError);
      err->message = pcVar5;
      if (psVar8 != &local_98) {
        operator_delete(psVar8,local_98 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
    }
  }
  return (HelicsCore)0x0;
}

Assistant:

HelicsCore helicsCreateCore(const char* type, const char* name, const char* initString, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }

    const helics::CoreType coretype = (type != nullptr) ? helics::core::coreTypeFromString(type) : helics::CoreType::DEFAULT;

    if (coretype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string("core type ") + type + " is not recognized");
        }
        return nullptr;
    }
    try {
        auto core = std::make_unique<helics::CoreObject>();
        core->valid = gCoreValidationIdentifier;
        auto nstring = AS_STRING_VIEW(name);
        if (nstring.empty()) {
            core->coreptr = helics::CoreFactory::create(coretype, AS_STRING_VIEW(initString));
        } else {
            core->coreptr = helics::CoreFactory::FindOrCreate(coretype, nstring, AS_STRING_VIEW(initString));
        }

        auto* retcore = reinterpret_cast<HelicsCore>(core.get());
        getMasterHolder()->addCore(std::move(core));
        return retcore;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}